

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_edges(Mesh *this)

{
  bool bVar1;
  pointer pHVar2;
  EdgeIter *pEVar3;
  Edge *element;
  pointer pEVar4;
  pointer pVVar5;
  pointer pVVar6;
  Mesh *in_RDI;
  EdgeCIter e_1;
  DrawStyle *style;
  EdgeIter e;
  Edge *ep;
  HalfedgeMesh *in_stack_ffffffffffffff88;
  _Self local_38;
  _Self local_30;
  _List_node_base *local_28;
  DrawStyle *local_20;
  _List_node_base *local_18;
  Edge *local_10;
  
  if ((global_render_mask & 2) != 0) {
    if (((((in_RDI->super_SceneObject).scene)->hovered).element != (HalfedgeElement *)0x0) &&
       (local_10 = HalfedgeElement::getEdge((HalfedgeElement *)in_RDI), local_10 != (Edge *)0x0)) {
      Edge::halfedge(local_10);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_RDI);
      pEVar3 = Halfedge::edge(pHVar2);
      local_28 = pEVar3->_M_node;
      local_18 = local_28;
      element = elementAddress((EdgeIter)0x1ffa73);
      local_20 = get_draw_style(in_RDI,&element->super_HalfedgeElement);
      DrawStyle::style_edge((DrawStyle *)in_RDI);
      glBegin(1);
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x1ffaa3);
      Edge::halfedge(pEVar4);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::vertex(pHVar2);
      pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)in_RDI);
      glVertex3dv(&pVVar5->position);
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x1ffad9);
      Edge::halfedge(pEVar4);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::twin(pHVar2);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::vertex(pHVar2);
      pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)in_RDI);
      glVertex3dv(&pVVar5->position);
      glEnd();
    }
    DrawStyle::style_edge((DrawStyle *)in_RDI);
    glBegin(1);
    local_30._M_node = (_List_node_base *)HalfedgeMesh::edgesBegin(in_stack_ffffffffffffff88);
    while( true ) {
      local_38._M_node = (_List_node_base *)HalfedgeMesh::edgesEnd(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      std::_List_const_iterator<CMU462::Edge>::operator->
                ((_List_const_iterator<CMU462::Edge> *)in_RDI);
      Edge::halfedge((Edge *)in_stack_ffffffffffffff88);
      std::_List_const_iterator<CMU462::Halfedge>::operator->
                ((_List_const_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::vertex((Halfedge *)in_stack_ffffffffffffff88);
      pVVar6 = std::_List_const_iterator<CMU462::Vertex>::operator->
                         ((_List_const_iterator<CMU462::Vertex> *)in_RDI);
      glVertex3dv(&pVVar6->position);
      std::_List_const_iterator<CMU462::Edge>::operator->
                ((_List_const_iterator<CMU462::Edge> *)in_RDI);
      Edge::halfedge((Edge *)in_stack_ffffffffffffff88);
      std::_List_const_iterator<CMU462::Halfedge>::operator->
                ((_List_const_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::twin((Halfedge *)in_stack_ffffffffffffff88);
      std::_List_const_iterator<CMU462::Halfedge>::operator->
                ((_List_const_iterator<CMU462::Halfedge> *)in_RDI);
      Halfedge::vertex((Halfedge *)in_stack_ffffffffffffff88);
      pVVar6 = std::_List_const_iterator<CMU462::Vertex>::operator->
                         ((_List_const_iterator<CMU462::Vertex> *)in_RDI);
      glVertex3dv(&pVVar6->position);
      std::_List_const_iterator<CMU462::Edge>::operator++(&local_30,0);
    }
    glEnd();
    DrawStyle::style_reset((DrawStyle *)0x1ffc46);
  }
  return;
}

Assistant:

void Mesh::draw_edges() const {
  if(!(global_render_mask & RenderMask::EDGE))
    return;

  // Draw seleted edge
  if(scene->hovered.element != nullptr) {
    Edge *ep = scene->hovered.element->getEdge();
    if (ep) {
      EdgeIter e = ep->halfedge()->edge();

      DrawStyle *style = get_draw_style(elementAddress(e));
      style->style_edge();

      glBegin(GL_LINES);
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
      glEnd();
    }
  }

  // Draw all edges
  defaultStyle->style_edge();
  glBegin(GL_LINES);
  for (EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
    glVertex3dv(&e->halfedge()->vertex()->position.x);
    glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
  }
  glEnd();

  defaultStyle->style_reset();
}